

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

int dedotdotify(char *input,size_t clen,char **outp)

{
  char cVar1;
  CURLcode CVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  char *__s;
  void *pvVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  dynbuf out;
  dynbuf local_50;
  
  *outp = (char *)0x0;
  if (clen < 2) {
    return 0;
  }
  Curl_dyn_init(&local_50,clen + 1);
  if (*input == '.') {
    input = input + 1;
    clen = clen - 1;
LAB_00166785:
    cVar1 = *input;
    if (cVar1 == '.') {
      lVar4 = -1;
      lVar8 = 1;
LAB_00166803:
      uVar5 = lVar4 + clen;
      if (uVar5 == 0) goto LAB_00166962;
      if (input[lVar8] != '/') goto LAB_0016682a;
      input = input + lVar8;
    }
    else {
      uVar5 = clen;
      if (cVar1 != '/') {
        if (((cVar1 != '%' || clen < 3) || (input[1] != '2')) || ((input[2] & 0xdfU) != 0x45))
        goto LAB_0016682a;
        lVar4 = -3;
        lVar8 = 3;
        goto LAB_00166803;
      }
    }
    clen = uVar5 - 1;
    if (clen == 0) goto LAB_00166962;
    input = input + 1;
  }
  else if (((*input == '%' && clen != 2) && (input[1] == '2')) && ((input[2] & 0xdfU) == 0x45)) {
    clen = clen - 3;
    if (clen == 0) goto LAB_00166962;
    input = input + 3;
    goto LAB_00166785;
  }
LAB_0016682a:
  if (*input == '/') {
    if (input[1] == '.') {
      pcVar9 = input + 2;
      uVar5 = clen - 2;
    }
    else {
      uVar5 = clen - 4;
      if (((0xfffffffffffffffc < uVar5) || (input[1] != '%')) ||
         ((input[2] != '2' || ((input[3] & 0xdfU) != 0x45)))) goto LAB_001668c6;
      pcVar9 = input + 4;
    }
    if (uVar5 == 0) {
LAB_00166941:
      CVar2 = Curl_dyn_addn(&local_50,"/",1);
LAB_00166959:
      if (CVar2 != CURLE_OK) {
        return 1;
      }
LAB_00166962:
      sVar7 = Curl_dyn_len(&local_50);
      if (sVar7 == 0) {
        pcVar9 = (*Curl_cstrdup)("");
        *outp = pcVar9;
        uVar3 = (uint)(pcVar9 == (char *)0x0);
      }
      else {
        pcVar9 = Curl_dyn_ptr(&local_50);
        *outp = pcVar9;
        uVar3 = 0;
      }
      return uVar3;
    }
    cVar1 = *pcVar9;
    CVar2 = CURLE_OK;
    if (cVar1 == '.') {
      lVar4 = -1;
      lVar8 = 1;
LAB_001668ba:
      uVar5 = uVar5 + lVar4;
      if ((uVar5 != 0) && (pcVar9[lVar8] != '/')) goto LAB_001668c6;
      sVar7 = Curl_dyn_len(&local_50);
      if (sVar7 != 0) {
        __s = Curl_dyn_ptr(&local_50);
        pvVar6 = memrchr(__s,0x2f,sVar7);
        if (pvVar6 != (void *)0x0) {
          Curl_dyn_setlen(&local_50,(long)pvVar6 - (long)__s);
        }
      }
      if (uVar5 == 0) goto LAB_00166941;
      pcVar9 = pcVar9 + lVar8;
    }
    else if (cVar1 != '/') {
      if ((((uVar5 < 3) || (cVar1 != '%')) || (pcVar9[1] != '2')) || ((pcVar9[2] & 0xdfU) != 0x45))
      goto LAB_001668c6;
      lVar4 = -3;
      lVar8 = 3;
      goto LAB_001668ba;
    }
  }
  else {
LAB_001668c6:
    CVar2 = Curl_dyn_addn(&local_50,input,1);
    pcVar9 = input + 1;
    uVar5 = clen - 1;
  }
  if ((uVar5 == 0) || (input = pcVar9, clen = uVar5, CVar2 != CURLE_OK)) goto LAB_00166959;
  goto LAB_0016682a;
}

Assistant:

UNITTEST int dedotdotify(const char *input, size_t clen, char **outp)
{
  struct dynbuf out;
  CURLcode result = CURLE_OK;

  *outp = NULL;
  /* the path always starts with a slash, and a slash has not dot */
  if(clen < 2)
    return 0;

  Curl_dyn_init(&out, clen + 1);

  /*  A. If the input buffer begins with a prefix of "../" or "./", then
      remove that prefix from the input buffer; otherwise, */
  if(is_dot(&input, &clen)) {
    const char *p = input;
    size_t blen = clen;

    if(!clen)
      /* . [end] */
      goto end;
    else if(ISSLASH(*p)) {
      /* one dot followed by a slash */
      input = p + 1;
      clen--;
    }

    /*  D. if the input buffer consists only of "." or "..", then remove
        that from the input buffer; otherwise, */
    else if(is_dot(&p, &blen)) {
      if(!blen)
        /* .. [end] */
        goto end;
      else if(ISSLASH(*p)) {
        /* ../ */
        input = p + 1;
        clen = blen - 1;
      }
    }
  }

  while(clen && !result) { /* until end of path content */
    if(ISSLASH(*input)) {
      const char *p = &input[1];
      size_t blen = clen - 1;
      /*  B. if the input buffer begins with a prefix of "/./" or "/.", where
          "."  is a complete path segment, then replace that prefix with "/" in
          the input buffer; otherwise, */
      if(is_dot(&p, &blen)) {
        if(!blen) { /* /. */
          result = Curl_dyn_addn(&out, "/", 1);
          break;
        }
        else if(ISSLASH(*p)) { /* /./ */
          input = p;
          clen = blen;
          continue;
        }

        /*  C. if the input buffer begins with a prefix of "/../" or "/..",
            where ".." is a complete path segment, then replace that prefix
            with "/" in the input buffer and remove the last segment and its
            preceding "/" (if any) from the output buffer; otherwise, */
        else if(is_dot(&p, &blen) && (ISSLASH(*p) || !blen)) {
          /* remove the last segment from the output buffer */
          size_t len = Curl_dyn_len(&out);
          if(len) {
            char *ptr = Curl_dyn_ptr(&out);
            char *last = memrchr(ptr, '/', len);
            if(last)
              /* trim the output at the slash */
              Curl_dyn_setlen(&out, last - ptr);
          }

          if(blen) { /* /../ */
            input = p;
            clen = blen;
            continue;
          }
          result = Curl_dyn_addn(&out, "/", 1);
          break;
        }
      }
    }

    /*  E. move the first path segment in the input buffer to the end of
        the output buffer, including the initial "/" character (if any) and
        any subsequent characters up to, but not including, the next "/"
        character or the end of the input buffer. */

    result = Curl_dyn_addn(&out, input, 1);
    input++;
    clen--;
  }
end:
  if(!result) {
    if(Curl_dyn_len(&out))
      *outp = Curl_dyn_ptr(&out);
    else {
      *outp = strdup("");
      if(!*outp)
        return 1;
    }
  }
  return result ? 1 : 0; /* success */
}